

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.h
# Opt level: O1

double __thiscall
MathML::AST::ConstantExpression::unaryOperation<double>
          (ConstantExpression *this,double *operand,Operator op)

{
  ErrorHandler *pEVar1;
  String *pSVar2;
  ostream *poVar3;
  double dVar4;
  Error error;
  ostringstream oss;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  undefined **local_1e8;
  undefined4 local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  double local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (op == NOT) {
    dVar4 = (double)(-(ulong)(*operand == 0.0) & 0x3ff0000000000000);
  }
  else if (op == SUB) {
    dVar4 = -*operand;
  }
  else {
    if (op != ADD) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"invalid operator: ",0x12);
      pSVar2 = UnaryExpression::operatorString_abi_cxx11_(op);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pSVar2->_M_dataplus)._M_p,pSVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,", cause operand not of type \'bool\' [f, t]",0x29);
      pEVar1 = this->mErrorHandler;
      if (pEVar1 != (ErrorHandler *)0x0) {
        std::__cxx11::stringbuf::str();
        local_1e8 = &PTR__Error_009e2c80;
        local_1e0 = 0;
        local_1d8[0] = local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,local_208,local_200 + (long)local_208);
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_1e8);
        local_1b8 = *operand;
        uStack_1b0 = 0;
        local_1e8 = &PTR__Error_009e2c80;
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      if (pEVar1 != (ErrorHandler *)0x0) {
        return local_1b8;
      }
    }
    dVar4 = *operand;
  }
  return dVar4;
}

Assistant:

T ConstantExpression::unaryOperation( const T& operand, UnaryExpression::Operator op ) const
        {
            switch ( op )
            {

            case AST::UnaryExpression::ADD:
                //do nothing
                return operand;

            case AST::UnaryExpression::SUB:
                return ( -operand );

            case AST::UnaryExpression::NOT:
                return ( !operand );

            default:
                std::ostringstream oss;
                oss << "invalid operator: " << AST::UnaryExpression::operatorString( op ) << ", cause operand not of type 'bool' [f, t]";
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, oss.str() );
                    mErrorHandler->handleError( &error );
                    return operand;
                }
            }
            return operand;
        }